

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::avx::ConeCurveMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  byte bVar84;
  Scene *pSVar85;
  byte bVar86;
  undefined4 uVar87;
  ulong uVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar94;
  undefined1 auVar93 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar102;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar103;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar122;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar140;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  float fVar151;
  float fVar152;
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar159;
  undefined1 auVar157 [32];
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar167 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  float fVar183;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar184 [64];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar206 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  int local_5c4;
  RayQueryContext *local_5c0;
  Scene *local_5b8;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  uint local_59c;
  uint local_598;
  uint local_594;
  uint local_590;
  RTCFilterFunctionNArguments local_578;
  Primitive *local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined4 uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  pSVar85 = context->scene;
  uVar1 = (line->v0).field_0.i[0];
  pGVar9 = (pSVar85->geometries).items[line->sharedGeomID].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var11 = pGVar9[1].intersectionFilterN;
  uVar2 = (line->v0).field_0.i[1];
  uVar3 = (line->v0).field_0.i[2];
  uVar4 = (line->v0).field_0.i[3];
  uVar5 = (line->v0).field_0.i[4];
  auVar89._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar5 * (long)p_Var11);
  auVar89._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar1 * (long)p_Var11);
  uVar6 = (line->v0).field_0.i[5];
  auVar96._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar6 * (long)p_Var11);
  auVar96._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar2 * (long)p_Var11);
  uVar7 = (line->v0).field_0.i[6];
  auVar104._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar7 * (long)p_Var11);
  auVar104._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar3 * (long)p_Var11);
  uVar8 = (line->v0).field_0.i[7];
  auVar116._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar8 * (long)p_Var11);
  auVar116._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar4 * (long)p_Var11);
  auVar167._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar5 + 1) * (long)p_Var11);
  auVar167._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar1 + 1) * (long)p_Var11);
  auVar44 = vunpcklps_avx(auVar89,auVar104);
  auVar41 = vunpckhps_avx(auVar89,auVar104);
  auVar45 = vunpcklps_avx(auVar96,auVar116);
  auVar42 = vunpckhps_avx(auVar96,auVar116);
  auVar46 = vunpcklps_avx(auVar44,auVar45);
  auVar43 = vunpckhps_avx(auVar44,auVar45);
  auVar47 = vunpcklps_avx(auVar41,auVar42);
  auVar89 = vunpckhps_avx(auVar41,auVar42);
  auVar90._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar6 + 1) * (long)p_Var11);
  auVar90._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar2 + 1) * (long)p_Var11);
  auVar97._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar7 + 1) * (long)p_Var11);
  auVar97._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar3 + 1) * (long)p_Var11);
  auVar105._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar8 + 1) * (long)p_Var11);
  auVar105._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar4 + 1) * (long)p_Var11);
  auVar44 = vunpcklps_avx(auVar167,auVar97);
  auVar41 = vunpckhps_avx(auVar167,auVar97);
  auVar45 = vunpcklps_avx(auVar90,auVar105);
  auVar42 = vunpckhps_avx(auVar90,auVar105);
  auVar97 = vunpcklps_avx(auVar44,auVar45);
  auVar90 = vunpckhps_avx(auVar44,auVar45);
  auVar104 = vunpcklps_avx(auVar41,auVar42);
  auVar96 = vunpckhps_avx(auVar41,auVar42);
  auVar95 = vpcmpeqd_avx(auVar96._0_16_,auVar96._0_16_);
  auVar40 = vpcmpeqd_avx(auVar95,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar95 = vpcmpeqd_avx(auVar95,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  auVar91._16_16_ = auVar95;
  auVar91._0_16_ = auVar40;
  local_270 = vpshufd_avx(ZEXT416(line->sharedGeomID),0);
  local_280 = local_270;
  fVar197 = (ray->org).field_0.m128[1];
  auVar92._4_4_ = fVar197;
  auVar92._0_4_ = fVar197;
  auVar92._8_4_ = fVar197;
  auVar92._12_4_ = fVar197;
  auVar92._16_4_ = fVar197;
  auVar92._20_4_ = fVar197;
  auVar92._24_4_ = fVar197;
  auVar92._28_4_ = fVar197;
  fVar152 = (ray->dir).field_0.m128[2];
  fVar159 = (ray->dir).field_0.m128[0];
  fVar102 = (ray->dir).field_0.m128[1];
  auVar95 = ZEXT416((uint)(fVar159 * fVar159 + fVar102 * fVar102 + fVar152 * fVar152));
  auVar95 = vshufps_avx(auVar95,auVar95,0);
  auVar98._16_16_ = auVar95;
  auVar98._0_16_ = auVar95;
  auVar41 = vrcpps_avx(auVar98);
  fVar103 = auVar41._0_4_;
  fVar110 = auVar41._4_4_;
  auVar42._4_4_ = fVar110 * auVar95._4_4_;
  auVar42._0_4_ = fVar103 * auVar95._0_4_;
  fVar111 = auVar41._8_4_;
  auVar42._8_4_ = fVar111 * auVar95._8_4_;
  fVar112 = auVar41._12_4_;
  auVar42._12_4_ = fVar112 * auVar95._12_4_;
  fVar113 = auVar41._16_4_;
  auVar42._16_4_ = fVar113 * auVar95._0_4_;
  fVar114 = auVar41._20_4_;
  auVar42._20_4_ = fVar114 * auVar95._4_4_;
  fVar115 = auVar41._24_4_;
  auVar42._24_4_ = fVar115 * auVar95._8_4_;
  auVar42._28_4_ = auVar95._12_4_;
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = &DAT_3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar117._16_4_ = 0x3f800000;
  auVar117._20_4_ = 0x3f800000;
  auVar117._24_4_ = 0x3f800000;
  auVar117._28_4_ = 0x3f800000;
  auVar42 = vsubps_avx(auVar117,auVar42);
  fVar102 = auVar41._28_4_ + auVar42._28_4_;
  auVar45._4_4_ = (auVar46._4_4_ + auVar97._4_4_) * 0.5;
  auVar45._0_4_ = (auVar46._0_4_ + auVar97._0_4_) * 0.5;
  auVar45._8_4_ = (auVar46._8_4_ + auVar97._8_4_) * 0.5;
  auVar45._12_4_ = (auVar46._12_4_ + auVar97._12_4_) * 0.5;
  auVar45._16_4_ = (auVar46._16_4_ + auVar97._16_4_) * 0.5;
  auVar45._20_4_ = (auVar46._20_4_ + auVar97._20_4_) * 0.5;
  auVar45._24_4_ = (auVar46._24_4_ + auVar97._24_4_) * 0.5;
  auVar45._28_4_ = auVar46._28_4_ + auVar97._28_4_;
  auVar41._4_4_ = (auVar90._4_4_ + auVar43._4_4_) * 0.5;
  auVar41._0_4_ = (auVar90._0_4_ + auVar43._0_4_) * 0.5;
  auVar41._8_4_ = (auVar90._8_4_ + auVar43._8_4_) * 0.5;
  auVar41._12_4_ = (auVar90._12_4_ + auVar43._12_4_) * 0.5;
  auVar41._16_4_ = (auVar90._16_4_ + auVar43._16_4_) * 0.5;
  auVar41._20_4_ = (auVar90._20_4_ + auVar43._20_4_) * 0.5;
  auVar41._24_4_ = (auVar90._24_4_ + auVar43._24_4_) * 0.5;
  auVar41._28_4_ = auVar90._28_4_ + auVar43._28_4_;
  auVar44._4_4_ = (auVar47._4_4_ + auVar104._4_4_) * 0.5;
  auVar44._0_4_ = (auVar47._0_4_ + auVar104._0_4_) * 0.5;
  auVar44._8_4_ = (auVar47._8_4_ + auVar104._8_4_) * 0.5;
  auVar44._12_4_ = (auVar47._12_4_ + auVar104._12_4_) * 0.5;
  auVar44._16_4_ = (auVar47._16_4_ + auVar104._16_4_) * 0.5;
  auVar44._20_4_ = (auVar47._20_4_ + auVar104._20_4_) * 0.5;
  auVar44._24_4_ = (auVar47._24_4_ + auVar104._24_4_) * 0.5;
  auVar44._28_4_ = auVar47._28_4_ + auVar104._28_4_;
  fVar152 = (ray->org).field_0.m128[2];
  auVar153._4_4_ = fVar152;
  auVar153._0_4_ = fVar152;
  auVar153._8_4_ = fVar152;
  auVar153._12_4_ = fVar152;
  auVar153._16_4_ = fVar152;
  auVar153._20_4_ = fVar152;
  auVar153._24_4_ = fVar152;
  auVar153._28_4_ = fVar152;
  auVar41 = vsubps_avx(auVar41,auVar92);
  auVar44 = vsubps_avx(auVar44,auVar153);
  local_480 = (ray->dir).field_0.m128[2];
  local_140 = (ray->dir).field_0.m128[1];
  fVar159 = (ray->org).field_0.m128[0];
  auVar123._4_4_ = fVar159;
  auVar123._0_4_ = fVar159;
  auVar123._8_4_ = fVar159;
  auVar123._12_4_ = fVar159;
  auVar123._16_4_ = fVar159;
  auVar123._20_4_ = fVar159;
  auVar123._24_4_ = fVar159;
  auVar123._28_4_ = fVar159;
  local_160 = (ray->dir).field_0.m128[0];
  auVar45 = vsubps_avx(auVar45,auVar123);
  fStack_404 = auVar45._28_4_ + auVar41._28_4_ + auVar44._28_4_;
  local_420 = (local_160 * auVar45._0_4_ + auVar41._0_4_ * local_140 + local_480 * auVar44._0_4_) *
              (fVar103 + fVar103 * auVar42._0_4_);
  fStack_41c = (local_160 * auVar45._4_4_ + auVar41._4_4_ * local_140 + local_480 * auVar44._4_4_) *
               (fVar110 + fVar110 * auVar42._4_4_);
  fStack_418 = (local_160 * auVar45._8_4_ + auVar41._8_4_ * local_140 + local_480 * auVar44._8_4_) *
               (fVar111 + fVar111 * auVar42._8_4_);
  fStack_414 = (local_160 * auVar45._12_4_ + auVar41._12_4_ * local_140 + local_480 * auVar44._12_4_
               ) * (fVar112 + fVar112 * auVar42._12_4_);
  fStack_410 = (local_160 * auVar45._16_4_ + auVar41._16_4_ * local_140 + local_480 * auVar44._16_4_
               ) * (fVar113 + fVar113 * auVar42._16_4_);
  fStack_40c = (local_160 * auVar45._20_4_ + auVar41._20_4_ * local_140 + local_480 * auVar44._20_4_
               ) * (fVar114 + fVar114 * auVar42._20_4_);
  fStack_408 = (local_160 * auVar45._24_4_ + auVar41._24_4_ * local_140 + local_480 * auVar44._24_4_
               ) * (fVar115 + fVar115 * auVar42._24_4_);
  auVar118._0_4_ = fVar159 + local_160 * local_420;
  auVar118._4_4_ = fVar159 + local_160 * fStack_41c;
  auVar118._8_4_ = fVar159 + local_160 * fStack_418;
  auVar118._12_4_ = fVar159 + local_160 * fStack_414;
  auVar118._16_4_ = fVar159 + local_160 * fStack_410;
  auVar118._20_4_ = fVar159 + local_160 * fStack_40c;
  auVar118._24_4_ = fVar159 + local_160 * fStack_408;
  auVar118._28_4_ = fVar159 + fVar102;
  auVar99._0_4_ = fVar197 + local_140 * local_420;
  auVar99._4_4_ = fVar197 + local_140 * fStack_41c;
  auVar99._8_4_ = fVar197 + local_140 * fStack_418;
  auVar99._12_4_ = fVar197 + local_140 * fStack_414;
  auVar99._16_4_ = fVar197 + local_140 * fStack_410;
  auVar99._20_4_ = fVar197 + local_140 * fStack_40c;
  auVar99._24_4_ = fVar197 + local_140 * fStack_408;
  auVar99._28_4_ = fVar197 + fVar102;
  auVar198._0_4_ = fVar152 + local_480 * local_420;
  auVar198._4_4_ = fVar152 + local_480 * fStack_41c;
  auVar198._8_4_ = fVar152 + local_480 * fStack_418;
  auVar198._12_4_ = fVar152 + local_480 * fStack_414;
  auVar198._16_4_ = fVar152 + local_480 * fStack_410;
  auVar198._20_4_ = fVar152 + local_480 * fStack_40c;
  auVar198._24_4_ = fVar152 + local_480 * fStack_408;
  auVar198._28_4_ = fVar152 + fVar197;
  local_360 = vsubps_avx(auVar90,auVar43);
  local_380 = vsubps_avx(auVar104,auVar47);
  fVar152 = local_380._0_4_;
  fVar112 = local_380._4_4_;
  fVar15 = local_380._8_4_;
  fVar20 = local_380._12_4_;
  fVar25 = local_380._16_4_;
  fVar30 = local_380._20_4_;
  fVar35 = local_380._24_4_;
  fVar159 = local_360._0_4_;
  fVar113 = local_360._4_4_;
  fVar16 = local_360._8_4_;
  fVar21 = local_360._12_4_;
  fVar26 = local_360._16_4_;
  fVar31 = local_360._20_4_;
  fVar36 = local_360._24_4_;
  local_3e0 = vsubps_avx(auVar97,auVar46);
  fVar102 = local_3e0._0_4_;
  fVar114 = local_3e0._4_4_;
  fVar17 = local_3e0._8_4_;
  fVar22 = local_3e0._12_4_;
  fVar27 = local_3e0._16_4_;
  fVar32 = local_3e0._20_4_;
  fVar37 = local_3e0._24_4_;
  auVar132._0_4_ = fVar102 * fVar102 + fVar159 * fVar159 + fVar152 * fVar152;
  auVar132._4_4_ = fVar114 * fVar114 + fVar113 * fVar113 + fVar112 * fVar112;
  auVar132._8_4_ = fVar17 * fVar17 + fVar16 * fVar16 + fVar15 * fVar15;
  auVar132._12_4_ = fVar22 * fVar22 + fVar21 * fVar21 + fVar20 * fVar20;
  auVar132._16_4_ = fVar27 * fVar27 + fVar26 * fVar26 + fVar25 * fVar25;
  auVar132._20_4_ = fVar32 * fVar32 + fVar31 * fVar31 + fVar30 * fVar30;
  auVar132._24_4_ = fVar37 * fVar37 + fVar36 * fVar36 + fVar35 * fVar35;
  auVar132._28_4_ = fStack_404 + fStack_404 + fVar197;
  _local_3a0 = vsubps_avx(auVar99,auVar43);
  _local_3c0 = vsubps_avx(auVar198,auVar47);
  fVar103 = local_3c0._0_4_;
  fVar115 = local_3c0._4_4_;
  fVar192 = local_3c0._8_4_;
  fVar193 = local_3c0._12_4_;
  fVar194 = local_3c0._16_4_;
  fVar195 = local_3c0._20_4_;
  fVar196 = local_3c0._24_4_;
  fVar110 = local_3a0._0_4_;
  fVar200 = local_3a0._4_4_;
  fVar201 = local_3a0._8_4_;
  fVar202 = local_3a0._12_4_;
  fVar203 = local_3a0._16_4_;
  fVar204 = local_3a0._20_4_;
  fVar205 = local_3a0._24_4_;
  fVar94 = fStack_404 + fStack_404 + fVar197;
  _local_2a0 = vsubps_avx(auVar118,auVar46);
  fVar197 = local_2a0._0_4_;
  fVar13 = local_2a0._4_4_;
  fVar18 = local_2a0._8_4_;
  fVar23 = local_2a0._12_4_;
  fVar28 = local_2a0._16_4_;
  fVar33 = local_2a0._20_4_;
  fVar38 = local_2a0._24_4_;
  fVar183 = fVar102 * fVar197 + fVar159 * fVar110 + fVar152 * fVar103;
  fVar185 = fVar114 * fVar13 + fVar113 * fVar200 + fVar112 * fVar115;
  fVar186 = fVar17 * fVar18 + fVar16 * fVar201 + fVar15 * fVar192;
  fVar187 = fVar22 * fVar23 + fVar21 * fVar202 + fVar20 * fVar193;
  fVar188 = fVar27 * fVar28 + fVar26 * fVar203 + fVar25 * fVar194;
  fVar189 = fVar32 * fVar33 + fVar31 * fVar204 + fVar30 * fVar195;
  fVar190 = fVar37 * fVar38 + fVar36 * fVar205 + fVar35 * fVar196;
  fVar191 = fStack_404 + fVar94;
  fVar94 = fStack_404 + fVar94;
  auVar181._0_4_ = fVar102 * local_160 + fVar159 * local_140 + fVar152 * local_480;
  auVar181._4_4_ = fVar114 * local_160 + fVar113 * local_140 + fVar112 * local_480;
  auVar181._8_4_ = fVar17 * local_160 + fVar16 * local_140 + fVar15 * local_480;
  auVar181._12_4_ = fVar22 * local_160 + fVar21 * local_140 + fVar20 * local_480;
  auVar181._16_4_ = fVar27 * local_160 + fVar26 * local_140 + fVar25 * local_480;
  auVar181._20_4_ = fVar32 * local_160 + fVar31 * local_140 + fVar30 * local_480;
  auVar181._24_4_ = fVar37 * local_160 + fVar36 * local_140 + fVar35 * local_480;
  auVar181._28_4_ = fStack_404 + fVar94;
  fStack_13c = local_140;
  fStack_138 = local_140;
  fStack_134 = local_140;
  fStack_130 = local_140;
  fStack_12c = local_140;
  fStack_128 = local_140;
  fStack_124 = local_140;
  fStack_15c = local_160;
  fStack_158 = local_160;
  fStack_154 = local_160;
  fStack_150 = local_160;
  fStack_14c = local_160;
  fStack_148 = local_160;
  fStack_144 = local_160;
  fVar48 = local_360._28_4_;
  auVar41 = vsubps_avx(auVar89,auVar96);
  fVar111 = auVar41._0_4_;
  fVar14 = auVar41._4_4_;
  fVar19 = auVar41._8_4_;
  fVar24 = auVar41._12_4_;
  fVar29 = auVar41._16_4_;
  fVar34 = auVar41._20_4_;
  fVar39 = auVar41._24_4_;
  local_300 = fVar111 * fVar111 + auVar132._0_4_;
  fStack_2fc = fVar14 * fVar14 + auVar132._4_4_;
  fStack_2f8 = fVar19 * fVar19 + auVar132._8_4_;
  fStack_2f4 = fVar24 * fVar24 + auVar132._12_4_;
  fStack_2f0 = fVar29 * fVar29 + auVar132._16_4_;
  fStack_2ec = fVar34 * fVar34 + auVar132._20_4_;
  fStack_2e8 = fVar39 * fVar39 + auVar132._24_4_;
  fVar151 = auVar132._0_4_ * auVar132._0_4_;
  fVar158 = auVar132._4_4_ * auVar132._4_4_;
  local_180._4_4_ = fVar158;
  local_180._0_4_ = fVar151;
  fVar160 = auVar132._8_4_ * auVar132._8_4_;
  fStack_178 = fVar160;
  fVar161 = auVar132._12_4_ * auVar132._12_4_;
  fStack_174 = fVar161;
  fVar162 = auVar132._16_4_ * auVar132._16_4_;
  fStack_170 = fVar162;
  fVar163 = auVar132._20_4_ * auVar132._20_4_;
  fStack_16c = fVar163;
  fVar164 = auVar132._24_4_ * auVar132._24_4_;
  fStack_168 = fVar164;
  uStack_164 = local_380._28_4_;
  auVar43._4_4_ = fVar158 * (local_160 * fVar13 + local_140 * fVar200 + local_480 * fVar115);
  auVar43._0_4_ = fVar151 * (local_160 * fVar197 + local_140 * fVar110 + local_480 * fVar103);
  auVar43._8_4_ = fVar160 * (local_160 * fVar18 + local_140 * fVar201 + local_480 * fVar192);
  auVar43._12_4_ = fVar161 * (local_160 * fVar23 + local_140 * fVar202 + local_480 * fVar193);
  auVar43._16_4_ = fVar162 * (local_160 * fVar28 + local_140 * fVar203 + local_480 * fVar194);
  auVar43._20_4_ = fVar163 * (local_160 * fVar33 + local_140 * fVar204 + local_480 * fVar195);
  auVar43._24_4_ = fVar164 * (local_160 * fVar38 + local_140 * fVar205 + local_480 * fVar196);
  auVar43._28_4_ = fStack_404 + fStack_404 + fVar94;
  auVar46._4_4_ = fStack_2fc * auVar181._4_4_ * fVar185;
  auVar46._0_4_ = local_300 * auVar181._0_4_ * fVar183;
  auVar46._8_4_ = fStack_2f8 * auVar181._8_4_ * fVar186;
  auVar46._12_4_ = fStack_2f4 * auVar181._12_4_ * fVar187;
  auVar46._16_4_ = fStack_2f0 * auVar181._16_4_ * fVar188;
  auVar46._20_4_ = fStack_2ec * auVar181._20_4_ * fVar189;
  auVar46._24_4_ = fStack_2e8 * auVar181._24_4_ * fVar190;
  auVar46._28_4_ = fVar48;
  auVar42 = vsubps_avx(auVar43,auVar46);
  fVar140 = auVar89._0_4_;
  fVar122 = fVar140 * auVar132._0_4_;
  fVar145 = auVar89._4_4_;
  fVar126 = fVar145 * auVar132._4_4_;
  auVar47._4_4_ = fVar126;
  auVar47._0_4_ = fVar122;
  fVar146 = auVar89._8_4_;
  fVar127 = fVar146 * auVar132._8_4_;
  auVar47._8_4_ = fVar127;
  fVar147 = auVar89._12_4_;
  fVar128 = fVar147 * auVar132._12_4_;
  auVar47._12_4_ = fVar128;
  fVar148 = auVar89._16_4_;
  fVar129 = fVar148 * auVar132._16_4_;
  auVar47._16_4_ = fVar129;
  fVar149 = auVar89._20_4_;
  fVar130 = fVar149 * auVar132._20_4_;
  auVar47._20_4_ = fVar130;
  fVar150 = auVar89._24_4_;
  fVar131 = fVar150 * auVar132._24_4_;
  auVar47._24_4_ = fVar131;
  auVar47._28_4_ = fVar48;
  fVar94 = local_3a0._28_4_;
  auVar93._0_4_ = fVar122 * auVar181._0_4_ * fVar111 + auVar42._0_4_;
  auVar93._4_4_ = fVar126 * auVar181._4_4_ * fVar14 + auVar42._4_4_;
  auVar93._8_4_ = fVar127 * auVar181._8_4_ * fVar19 + auVar42._8_4_;
  auVar93._12_4_ = fVar128 * auVar181._12_4_ * fVar24 + auVar42._12_4_;
  auVar93._16_4_ = fVar129 * auVar181._16_4_ * fVar29 + auVar42._16_4_;
  auVar93._20_4_ = fVar130 * auVar181._20_4_ * fVar34 + auVar42._20_4_;
  auVar93._24_4_ = fVar131 * auVar181._24_4_ * fVar39 + auVar42._24_4_;
  auVar93._28_4_ = fVar94 + auVar42._28_4_;
  auVar49._4_4_ = fVar158 * (fVar13 * fVar13 + fVar200 * fVar200 + fVar115 * fVar115);
  auVar49._0_4_ = fVar151 * (fVar197 * fVar197 + fVar110 * fVar110 + fVar103 * fVar103);
  auVar49._8_4_ = fVar160 * (fVar18 * fVar18 + fVar201 * fVar201 + fVar192 * fVar192);
  auVar49._12_4_ = fVar161 * (fVar23 * fVar23 + fVar202 * fVar202 + fVar193 * fVar193);
  auVar49._16_4_ = fVar162 * (fVar28 * fVar28 + fVar203 * fVar203 + fVar194 * fVar194);
  auVar49._20_4_ = fVar163 * (fVar33 * fVar33 + fVar204 * fVar204 + fVar195 * fVar195);
  auVar49._24_4_ = fVar164 * (fVar38 * fVar38 + fVar205 * fVar205 + fVar196 * fVar196);
  auVar49._28_4_ = fVar48 + fVar48 + fStack_404;
  auVar50._4_4_ = fStack_2fc * fVar185 * fVar185;
  auVar50._0_4_ = local_300 * fVar183 * fVar183;
  auVar50._8_4_ = fStack_2f8 * fVar186 * fVar186;
  auVar50._12_4_ = fStack_2f4 * fVar187 * fVar187;
  auVar50._16_4_ = fStack_2f0 * fVar188 * fVar188;
  auVar50._20_4_ = fStack_2ec * fVar189 * fVar189;
  auVar50._24_4_ = fStack_2e8 * fVar190 * fVar190;
  auVar50._28_4_ = fVar94;
  auVar42 = vsubps_avx(auVar49,auVar50);
  auVar51._4_4_ = fVar185 * (fVar14 + fVar14);
  auVar51._0_4_ = fVar183 * (fVar111 + fVar111);
  auVar51._8_4_ = fVar186 * (fVar19 + fVar19);
  auVar51._12_4_ = fVar187 * (fVar24 + fVar24);
  auVar51._16_4_ = fVar188 * (fVar29 + fVar29);
  auVar51._20_4_ = fVar189 * (fVar34 + fVar34);
  auVar51._24_4_ = fVar190 * (fVar39 + fVar39);
  auVar51._28_4_ = auVar41._28_4_ + auVar41._28_4_;
  auVar41 = vsubps_avx(auVar51,auVar47);
  fVar165 = auVar181._0_4_ * auVar181._0_4_;
  fVar168 = auVar181._4_4_ * auVar181._4_4_;
  fVar170 = auVar181._8_4_ * auVar181._8_4_;
  fVar172 = auVar181._12_4_ * auVar181._12_4_;
  fVar174 = auVar181._16_4_ * auVar181._16_4_;
  fVar176 = auVar181._20_4_ * auVar181._20_4_;
  fVar178 = auVar181._24_4_ * auVar181._24_4_;
  auVar52._4_4_ = fVar168 * fStack_2fc;
  auVar52._0_4_ = fVar165 * local_300;
  auVar52._8_4_ = fVar170 * fStack_2f8;
  auVar52._12_4_ = fVar172 * fStack_2f4;
  auVar52._16_4_ = fVar174 * fStack_2f0;
  auVar52._20_4_ = fVar176 * fStack_2ec;
  auVar52._24_4_ = fVar178 * fStack_2e8;
  auVar52._28_4_ = fVar48;
  auVar44 = vsubps_avx(_local_180,auVar52);
  auVar53._4_4_ = auVar44._4_4_ * (auVar42._4_4_ + fVar126 * auVar41._4_4_);
  auVar53._0_4_ = auVar44._0_4_ * (auVar42._0_4_ + fVar122 * auVar41._0_4_);
  auVar53._8_4_ = auVar44._8_4_ * (auVar42._8_4_ + fVar127 * auVar41._8_4_);
  auVar53._12_4_ = auVar44._12_4_ * (auVar42._12_4_ + fVar128 * auVar41._12_4_);
  auVar53._16_4_ = auVar44._16_4_ * (auVar42._16_4_ + fVar129 * auVar41._16_4_);
  auVar53._20_4_ = auVar44._20_4_ * (auVar42._20_4_ + fVar130 * auVar41._20_4_);
  auVar53._24_4_ = auVar44._24_4_ * (auVar42._24_4_ + fVar131 * auVar41._24_4_);
  auVar53._28_4_ = auVar42._28_4_ + fVar48;
  auVar54._4_4_ = auVar93._4_4_ * auVar93._4_4_;
  auVar54._0_4_ = auVar93._0_4_ * auVar93._0_4_;
  auVar54._8_4_ = auVar93._8_4_ * auVar93._8_4_;
  auVar54._12_4_ = auVar93._12_4_ * auVar93._12_4_;
  auVar54._16_4_ = auVar93._16_4_ * auVar93._16_4_;
  auVar54._20_4_ = auVar93._20_4_ * auVar93._20_4_;
  auVar54._24_4_ = auVar93._24_4_ * auVar93._24_4_;
  auVar54._28_4_ = fVar48;
  auVar42 = vsubps_avx(auVar54,auVar53);
  auVar41 = vcmpps_avx(auVar42,ZEXT832(0) << 0x20,5);
  auVar45 = auVar41 & ~auVar91;
  if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar45 >> 0x7f,0) != '\0') ||
        (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar45 >> 0xbf,0) != '\0') ||
      (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar45[0x1f] < '\0') {
    auVar45 = vandnps_avx(auVar91,auVar41);
    auVar46 = vsubps_avx(auVar118,auVar97);
    auVar90 = vsubps_avx(auVar99,auVar90);
    auVar47 = vsubps_avx(auVar198,auVar104);
    fVar166 = auVar46._0_4_ * fVar102 + auVar47._0_4_ * fVar152 + auVar90._0_4_ * fVar159;
    fVar169 = auVar46._4_4_ * fVar114 + auVar47._4_4_ * fVar112 + auVar90._4_4_ * fVar113;
    fVar171 = auVar46._8_4_ * fVar17 + auVar47._8_4_ * fVar15 + auVar90._8_4_ * fVar16;
    fVar173 = auVar46._12_4_ * fVar22 + auVar47._12_4_ * fVar20 + auVar90._12_4_ * fVar21;
    fVar175 = auVar46._16_4_ * fVar27 + auVar47._16_4_ * fVar25 + auVar90._16_4_ * fVar26;
    fVar177 = auVar46._20_4_ * fVar32 + auVar47._20_4_ * fVar30 + auVar90._20_4_ * fVar31;
    fVar179 = auVar46._24_4_ * fVar37 + auVar47._24_4_ * fVar35 + auVar90._24_4_ * fVar36;
    auVar42 = vsqrtps_avx(auVar42);
    auVar41 = vrcpps_avx(auVar44);
    fVar122 = auVar41._0_4_;
    auVar199._0_4_ = auVar44._0_4_ * fVar122;
    fVar126 = auVar41._4_4_;
    auVar199._4_4_ = auVar44._4_4_ * fVar126;
    fVar127 = auVar41._8_4_;
    auVar199._8_4_ = auVar44._8_4_ * fVar127;
    fVar128 = auVar41._12_4_;
    auVar199._12_4_ = auVar44._12_4_ * fVar128;
    fVar129 = auVar41._16_4_;
    auVar199._16_4_ = auVar44._16_4_ * fVar129;
    fVar130 = auVar41._20_4_;
    auVar199._20_4_ = auVar44._20_4_ * fVar130;
    fVar131 = auVar41._24_4_;
    auVar199._24_4_ = auVar44._24_4_ * fVar131;
    auVar199._28_4_ = 0;
    auVar106._8_4_ = 0x3f800000;
    auVar106._0_8_ = &DAT_3f8000003f800000;
    auVar106._12_4_ = 0x3f800000;
    auVar106._16_4_ = 0x3f800000;
    auVar106._20_4_ = 0x3f800000;
    auVar106._24_4_ = 0x3f800000;
    auVar106._28_4_ = 0x3f800000;
    auVar41 = vsubps_avx(auVar106,auVar199);
    auVar107._8_4_ = 0x7fffffff;
    auVar107._0_8_ = 0x7fffffff7fffffff;
    auVar107._12_4_ = 0x7fffffff;
    auVar107._16_4_ = 0x7fffffff;
    auVar107._20_4_ = 0x7fffffff;
    auVar107._24_4_ = 0x7fffffff;
    auVar107._28_4_ = 0x7fffffff;
    fVar122 = auVar41._0_4_ * fVar122 + fVar122;
    fVar126 = auVar41._4_4_ * fVar126 + fVar126;
    fVar127 = auVar41._8_4_ * fVar127 + fVar127;
    fVar128 = auVar41._12_4_ * fVar128 + fVar128;
    fVar129 = auVar41._16_4_ * fVar129 + fVar129;
    fVar130 = auVar41._20_4_ * fVar130 + fVar130;
    fVar131 = auVar41._24_4_ * fVar131 + fVar131;
    auVar41 = vandps_avx(auVar44,auVar107);
    auVar154._8_4_ = 0x219392ef;
    auVar154._0_8_ = 0x219392ef219392ef;
    auVar154._12_4_ = 0x219392ef;
    auVar154._16_4_ = 0x219392ef;
    auVar154._20_4_ = 0x219392ef;
    auVar154._24_4_ = 0x219392ef;
    auVar154._28_4_ = 0x219392ef;
    auVar41 = vcmpps_avx(auVar41,auVar154,2);
    uVar88 = CONCAT44(auVar93._4_4_,auVar93._0_4_);
    auVar155._0_8_ = uVar88 ^ 0x8000000080000000;
    auVar155._8_4_ = -auVar93._8_4_;
    auVar155._12_4_ = -auVar93._12_4_;
    auVar155._16_4_ = -auVar93._16_4_;
    auVar155._20_4_ = -auVar93._20_4_;
    auVar155._24_4_ = -auVar93._24_4_;
    auVar155._28_4_ = -auVar93._28_4_;
    auVar44 = vsubps_avx(auVar155,auVar42);
    auVar43 = vsubps_avx(auVar42,auVar93);
    auVar55._4_4_ = auVar44._4_4_ * fVar126;
    auVar55._0_4_ = auVar44._0_4_ * fVar122;
    auVar55._8_4_ = auVar44._8_4_ * fVar127;
    auVar55._12_4_ = auVar44._12_4_ * fVar128;
    auVar55._16_4_ = auVar44._16_4_ * fVar129;
    auVar55._20_4_ = auVar44._20_4_ * fVar130;
    auVar55._24_4_ = auVar44._24_4_ * fVar131;
    auVar55._28_4_ = auVar42._28_4_;
    auVar56._4_4_ = auVar43._4_4_ * fVar126;
    auVar56._0_4_ = auVar43._0_4_ * fVar122;
    auVar56._8_4_ = auVar43._8_4_ * fVar127;
    auVar56._12_4_ = auVar43._12_4_ * fVar128;
    auVar56._16_4_ = auVar43._16_4_ * fVar129;
    auVar56._20_4_ = auVar43._20_4_ * fVar130;
    auVar56._24_4_ = auVar43._24_4_ * fVar131;
    auVar56._28_4_ = auVar43._28_4_;
    auVar119._8_4_ = 0xff800000;
    auVar119._0_8_ = 0xff800000ff800000;
    auVar119._12_4_ = 0xff800000;
    auVar119._16_4_ = 0xff800000;
    auVar119._20_4_ = 0xff800000;
    auVar119._24_4_ = 0xff800000;
    auVar119._28_4_ = 0xff800000;
    auVar42 = vblendvps_avx(auVar55,auVar119,auVar41);
    auVar100._8_4_ = 0x7f800000;
    auVar100._0_8_ = 0x7f8000007f800000;
    auVar100._12_4_ = 0x7f800000;
    auVar100._16_4_ = 0x7f800000;
    auVar100._20_4_ = 0x7f800000;
    auVar100._24_4_ = 0x7f800000;
    auVar100._28_4_ = 0x7f800000;
    auVar44 = vblendvps_avx(auVar56,auVar100,auVar41);
    auVar156._0_4_ = fVar183 + auVar181._0_4_ * auVar42._0_4_;
    auVar156._4_4_ = fVar185 + auVar181._4_4_ * auVar42._4_4_;
    auVar156._8_4_ = fVar186 + auVar181._8_4_ * auVar42._8_4_;
    auVar156._12_4_ = fVar187 + auVar181._12_4_ * auVar42._12_4_;
    auVar156._16_4_ = fVar188 + auVar181._16_4_ * auVar42._16_4_;
    auVar156._20_4_ = fVar189 + auVar181._20_4_ * auVar42._20_4_;
    auVar156._24_4_ = fVar190 + auVar181._24_4_ * auVar42._24_4_;
    auVar156._28_4_ = fVar191 + auVar41._28_4_;
    auVar41 = vcmpps_avx(auVar156,ZEXT432(0) << 0x20,6);
    auVar43 = vcmpps_avx(auVar156,auVar132,1);
    auVar41 = vandps_avx(auVar43,auVar41);
    auVar41 = vandps_avx(auVar45,auVar41);
    local_440 = vblendvps_avx(auVar100,auVar42,auVar41);
    fVar57 = local_440._28_4_;
    auVar136._0_4_ = fVar183 + auVar181._0_4_ * auVar44._0_4_;
    auVar136._4_4_ = fVar185 + auVar181._4_4_ * auVar44._4_4_;
    auVar136._8_4_ = fVar186 + auVar181._8_4_ * auVar44._8_4_;
    auVar136._12_4_ = fVar187 + auVar181._12_4_ * auVar44._12_4_;
    auVar136._16_4_ = fVar188 + auVar181._16_4_ * auVar44._16_4_;
    auVar136._20_4_ = fVar189 + auVar181._20_4_ * auVar44._20_4_;
    auVar136._24_4_ = fVar190 + auVar181._24_4_ * auVar44._24_4_;
    auVar136._28_4_ = fVar191 + fVar57;
    auVar41 = vcmpps_avx(auVar136,ZEXT432(0) << 0x20,6);
    auVar42 = vcmpps_avx(auVar136,auVar132,1);
    auVar41 = vandps_avx(auVar42,auVar41);
    auVar41 = vandps_avx(auVar45,auVar41);
    local_460 = vblendvps_avx(auVar119,auVar44,auVar41);
    auVar44 = vrcpps_avx(auVar181);
    fVar122 = auVar44._0_4_;
    fVar126 = auVar44._4_4_;
    auVar58._4_4_ = auVar181._4_4_ * fVar126;
    auVar58._0_4_ = auVar181._0_4_ * fVar122;
    fVar127 = auVar44._8_4_;
    auVar58._8_4_ = auVar181._8_4_ * fVar127;
    fVar128 = auVar44._12_4_;
    auVar58._12_4_ = auVar181._12_4_ * fVar128;
    fVar129 = auVar44._16_4_;
    auVar58._16_4_ = auVar181._16_4_ * fVar129;
    fVar130 = auVar44._20_4_;
    auVar58._20_4_ = auVar181._20_4_ * fVar130;
    fVar131 = auVar44._24_4_;
    auVar58._24_4_ = auVar181._24_4_ * fVar131;
    auVar58._28_4_ = auVar41._28_4_;
    auVar120._8_4_ = 0x3f800000;
    auVar120._0_8_ = &DAT_3f8000003f800000;
    auVar120._12_4_ = 0x3f800000;
    auVar120._16_4_ = 0x3f800000;
    auVar120._20_4_ = 0x3f800000;
    auVar120._24_4_ = 0x3f800000;
    auVar120._28_4_ = 0x3f800000;
    auVar97 = vsubps_avx(auVar120,auVar58);
    fVar122 = fVar122 + fVar122 * auVar97._0_4_;
    fVar126 = fVar126 + fVar126 * auVar97._4_4_;
    fVar127 = fVar127 + fVar127 * auVar97._8_4_;
    fVar128 = fVar128 + fVar128 * auVar97._12_4_;
    fVar129 = fVar129 + fVar129 * auVar97._16_4_;
    fVar130 = fVar130 + fVar130 * auVar97._20_4_;
    fVar131 = fVar131 + fVar131 * auVar97._24_4_;
    auVar59._4_4_ = auVar181._4_4_ * fVar13;
    auVar59._0_4_ = auVar181._0_4_ * fVar197;
    auVar59._8_4_ = auVar181._8_4_ * fVar18;
    auVar59._12_4_ = auVar181._12_4_ * fVar23;
    auVar59._16_4_ = auVar181._16_4_ * fVar28;
    auVar59._20_4_ = auVar181._20_4_ * fVar33;
    auVar59._24_4_ = auVar181._24_4_ * fVar38;
    auVar59._28_4_ = auVar97._28_4_;
    auVar60._4_4_ = local_160 * fVar185;
    auVar60._0_4_ = local_160 * fVar183;
    auVar60._8_4_ = local_160 * fVar186;
    auVar60._12_4_ = local_160 * fVar187;
    auVar60._16_4_ = local_160 * fVar188;
    auVar60._20_4_ = local_160 * fVar189;
    auVar60._24_4_ = local_160 * fVar190;
    auVar60._28_4_ = auVar42._28_4_;
    auVar41 = vsubps_avx(auVar59,auVar60);
    auVar61._4_4_ = auVar181._4_4_ * fVar200;
    auVar61._0_4_ = auVar181._0_4_ * fVar110;
    auVar61._8_4_ = auVar181._8_4_ * fVar201;
    auVar61._12_4_ = auVar181._12_4_ * fVar202;
    auVar61._16_4_ = auVar181._16_4_ * fVar203;
    auVar61._20_4_ = auVar181._20_4_ * fVar204;
    auVar61._24_4_ = auVar181._24_4_ * fVar205;
    auVar61._28_4_ = auVar42._28_4_;
    auVar62._4_4_ = local_140 * fVar185;
    auVar62._0_4_ = local_140 * fVar183;
    auVar62._8_4_ = local_140 * fVar186;
    auVar62._12_4_ = local_140 * fVar187;
    auVar62._16_4_ = local_140 * fVar188;
    auVar62._20_4_ = local_140 * fVar189;
    auVar62._24_4_ = local_140 * fVar190;
    auVar62._28_4_ = auVar43._28_4_;
    auVar104 = vsubps_avx(auVar61,auVar62);
    auVar63._4_4_ = auVar181._4_4_ * fVar115;
    auVar63._0_4_ = auVar181._0_4_ * fVar103;
    auVar63._8_4_ = auVar181._8_4_ * fVar192;
    auVar63._12_4_ = auVar181._12_4_ * fVar193;
    auVar63._16_4_ = auVar181._16_4_ * fVar194;
    auVar63._20_4_ = auVar181._20_4_ * fVar195;
    auVar63._24_4_ = auVar181._24_4_ * fVar196;
    auVar63._28_4_ = auVar43._28_4_;
    auVar64._4_4_ = local_480 * fVar185;
    auVar64._0_4_ = local_480 * fVar183;
    auVar64._8_4_ = local_480 * fVar186;
    auVar64._12_4_ = local_480 * fVar187;
    auVar64._16_4_ = local_480 * fVar188;
    auVar64._20_4_ = local_480 * fVar189;
    auVar64._24_4_ = local_480 * fVar190;
    auVar64._28_4_ = auVar132._28_4_;
    auVar42 = vsubps_avx(auVar63,auVar64);
    auVar108._0_4_ =
         auVar41._0_4_ * auVar41._0_4_ +
         auVar104._0_4_ * auVar104._0_4_ + auVar42._0_4_ * auVar42._0_4_;
    auVar108._4_4_ =
         auVar41._4_4_ * auVar41._4_4_ +
         auVar104._4_4_ * auVar104._4_4_ + auVar42._4_4_ * auVar42._4_4_;
    auVar108._8_4_ =
         auVar41._8_4_ * auVar41._8_4_ +
         auVar104._8_4_ * auVar104._8_4_ + auVar42._8_4_ * auVar42._8_4_;
    auVar108._12_4_ =
         auVar41._12_4_ * auVar41._12_4_ +
         auVar104._12_4_ * auVar104._12_4_ + auVar42._12_4_ * auVar42._12_4_;
    auVar108._16_4_ =
         auVar41._16_4_ * auVar41._16_4_ +
         auVar104._16_4_ * auVar104._16_4_ + auVar42._16_4_ * auVar42._16_4_;
    auVar108._20_4_ =
         auVar41._20_4_ * auVar41._20_4_ +
         auVar104._20_4_ * auVar104._20_4_ + auVar42._20_4_ * auVar42._20_4_;
    auVar108._24_4_ =
         auVar41._24_4_ * auVar41._24_4_ +
         auVar104._24_4_ * auVar104._24_4_ + auVar42._24_4_ * auVar42._24_4_;
    auVar108._28_4_ = auVar41._28_4_ + auVar104._28_4_ + auVar42._28_4_;
    local_540._28_4_ = auVar89._28_4_;
    auVar65._4_4_ = fVar168 * fVar145 * fVar145;
    auVar65._0_4_ = fVar165 * fVar140 * fVar140;
    auVar65._8_4_ = fVar170 * fVar146 * fVar146;
    auVar65._12_4_ = fVar172 * fVar147 * fVar147;
    auVar65._16_4_ = fVar174 * fVar148 * fVar148;
    auVar65._20_4_ = fVar176 * fVar149 * fVar149;
    auVar65._24_4_ = fVar178 * fVar150 * fVar150;
    auVar65._28_4_ = local_540._28_4_;
    auVar41 = vcmpps_avx(auVar108,auVar65,1);
    auVar66._4_4_ = fVar126 * -fVar185;
    auVar66._0_4_ = fVar122 * -fVar183;
    auVar66._8_4_ = fVar127 * -fVar186;
    auVar66._12_4_ = fVar128 * -fVar187;
    auVar66._16_4_ = fVar129 * -fVar188;
    auVar66._20_4_ = fVar130 * -fVar189;
    auVar66._24_4_ = fVar131 * -fVar190;
    auVar66._28_4_ = -fVar191;
    auVar42 = vblendvps_avx(auVar100,auVar66,auVar41);
    auVar133._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar133._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->leftExists & 0xf) << 4));
    auVar41 = vandnps_avx(auVar133,auVar45);
    local_4e0 = vblendvps_avx(auVar100,auVar42,auVar41);
    auVar109._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar109._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar67._4_4_ = auVar181._4_4_ * auVar46._4_4_;
    auVar67._0_4_ = auVar181._0_4_ * auVar46._0_4_;
    auVar67._8_4_ = auVar181._8_4_ * auVar46._8_4_;
    auVar67._12_4_ = auVar181._12_4_ * auVar46._12_4_;
    auVar67._16_4_ = auVar181._16_4_ * auVar46._16_4_;
    auVar67._20_4_ = auVar181._20_4_ * auVar46._20_4_;
    auVar67._24_4_ = auVar181._24_4_ * auVar46._24_4_;
    auVar67._28_4_ = auVar46._28_4_;
    auVar68._4_4_ = auVar181._4_4_ * auVar90._4_4_;
    auVar68._0_4_ = auVar181._0_4_ * auVar90._0_4_;
    auVar68._8_4_ = auVar181._8_4_ * auVar90._8_4_;
    auVar68._12_4_ = auVar181._12_4_ * auVar90._12_4_;
    auVar68._16_4_ = auVar181._16_4_ * auVar90._16_4_;
    auVar68._20_4_ = auVar181._20_4_ * auVar90._20_4_;
    auVar68._24_4_ = auVar181._24_4_ * auVar90._24_4_;
    auVar68._28_4_ = auVar41._28_4_;
    auVar69._4_4_ = auVar181._4_4_ * auVar47._4_4_;
    auVar69._0_4_ = auVar181._0_4_ * auVar47._0_4_;
    auVar69._8_4_ = auVar181._8_4_ * auVar47._8_4_;
    auVar69._12_4_ = auVar181._12_4_ * auVar47._12_4_;
    auVar69._16_4_ = auVar181._16_4_ * auVar47._16_4_;
    auVar69._20_4_ = auVar181._20_4_ * auVar47._20_4_;
    auVar69._24_4_ = auVar181._24_4_ * auVar47._24_4_;
    auVar69._28_4_ = auVar104._28_4_;
    auVar70._4_4_ = local_160 * fVar169;
    auVar70._0_4_ = local_160 * fVar166;
    auVar70._8_4_ = local_160 * fVar171;
    auVar70._12_4_ = local_160 * fVar173;
    auVar70._16_4_ = local_160 * fVar175;
    auVar70._20_4_ = local_160 * fVar177;
    uVar87 = auVar47._28_4_;
    auVar70._24_4_ = local_160 * fVar179;
    auVar70._28_4_ = uVar87;
    auVar41 = vsubps_avx(auVar67,auVar70);
    auVar71._4_4_ = local_140 * fVar169;
    auVar71._0_4_ = local_140 * fVar166;
    auVar71._8_4_ = local_140 * fVar171;
    auVar71._12_4_ = local_140 * fVar173;
    auVar71._16_4_ = local_140 * fVar175;
    auVar71._20_4_ = local_140 * fVar177;
    auVar71._24_4_ = local_140 * fVar179;
    auVar71._28_4_ = uVar87;
    auVar42 = vsubps_avx(auVar68,auVar71);
    auVar72._4_4_ = local_480 * fVar169;
    auVar72._0_4_ = local_480 * fVar166;
    auVar72._8_4_ = local_480 * fVar171;
    auVar72._12_4_ = local_480 * fVar173;
    auVar72._16_4_ = local_480 * fVar175;
    auVar72._20_4_ = local_480 * fVar177;
    auVar72._24_4_ = local_480 * fVar179;
    auVar72._28_4_ = uVar87;
    auVar43 = vsubps_avx(auVar69,auVar72);
    fVar183 = auVar42._28_4_ + auVar43._28_4_;
    auVar124._0_4_ =
         auVar41._0_4_ * auVar41._0_4_ +
         auVar42._0_4_ * auVar42._0_4_ + auVar43._0_4_ * auVar43._0_4_;
    auVar124._4_4_ =
         auVar41._4_4_ * auVar41._4_4_ +
         auVar42._4_4_ * auVar42._4_4_ + auVar43._4_4_ * auVar43._4_4_;
    auVar124._8_4_ =
         auVar41._8_4_ * auVar41._8_4_ +
         auVar42._8_4_ * auVar42._8_4_ + auVar43._8_4_ * auVar43._8_4_;
    auVar124._12_4_ =
         auVar41._12_4_ * auVar41._12_4_ +
         auVar42._12_4_ * auVar42._12_4_ + auVar43._12_4_ * auVar43._12_4_;
    auVar124._16_4_ =
         auVar41._16_4_ * auVar41._16_4_ +
         auVar42._16_4_ * auVar42._16_4_ + auVar43._16_4_ * auVar43._16_4_;
    auVar124._20_4_ =
         auVar41._20_4_ * auVar41._20_4_ +
         auVar42._20_4_ * auVar42._20_4_ + auVar43._20_4_ * auVar43._20_4_;
    auVar124._24_4_ =
         auVar41._24_4_ * auVar41._24_4_ +
         auVar42._24_4_ * auVar42._24_4_ + auVar43._24_4_ * auVar43._24_4_;
    auVar124._28_4_ = auVar41._28_4_ + fVar183;
    local_400._0_4_ = auVar96._0_4_;
    local_400._4_4_ = auVar96._4_4_;
    fStack_3f8 = auVar96._8_4_;
    fStack_3f4 = auVar96._12_4_;
    fStack_3f0 = auVar96._16_4_;
    fStack_3ec = auVar96._20_4_;
    fStack_3e8 = auVar96._24_4_;
    auVar73._4_4_ = fVar168 * (float)local_400._4_4_ * (float)local_400._4_4_;
    auVar73._0_4_ = fVar165 * (float)local_400._0_4_ * (float)local_400._0_4_;
    auVar73._8_4_ = fVar170 * fStack_3f8 * fStack_3f8;
    auVar73._12_4_ = fVar172 * fStack_3f4 * fStack_3f4;
    auVar73._16_4_ = fVar174 * fStack_3f0 * fStack_3f0;
    auVar73._20_4_ = fVar176 * fStack_3ec * fStack_3ec;
    auVar73._24_4_ = fVar178 * fStack_3e8 * fStack_3e8;
    auVar73._28_4_ = fVar183;
    auVar95 = SUB3216(*(undefined1 (*) [32])((long)&(ray->org).field_0 + 0xc),0);
    auVar40 = vshufps_avx(auVar95,auVar95,0);
    auVar137._16_16_ = auVar40;
    auVar137._0_16_ = auVar40;
    auVar41 = vandnps_avx(auVar109,auVar45);
    auVar42 = vcmpps_avx(auVar124,auVar73,1);
    auVar74._4_4_ = fVar126 * -fVar169;
    auVar74._0_4_ = fVar122 * -fVar166;
    auVar74._8_4_ = fVar127 * -fVar171;
    auVar74._12_4_ = fVar128 * -fVar173;
    auVar74._16_4_ = fVar129 * -fVar175;
    auVar74._20_4_ = fVar130 * -fVar177;
    auVar74._24_4_ = fVar131 * -fVar179;
    auVar74._28_4_ = auVar44._28_4_ + auVar97._28_4_;
    auVar42 = vblendvps_avx(auVar100,auVar74,auVar42);
    auVar41 = vblendvps_avx(auVar100,auVar42,auVar41);
    auVar43 = vminps_avx(local_4e0,auVar41);
    auVar42 = vmaxps_avx(local_4e0,auVar41);
    auVar89 = vminps_avx(local_440,auVar43);
    auVar44 = vcmpps_avx(auVar89,auVar43,0);
    auVar41 = vcmpps_avx(auVar42,auVar100,0);
    auVar121._8_4_ = 0xff800000;
    auVar121._0_8_ = 0xff800000ff800000;
    auVar121._12_4_ = 0xff800000;
    auVar121._16_4_ = 0xff800000;
    auVar121._20_4_ = 0xff800000;
    auVar121._24_4_ = 0xff800000;
    auVar121._28_4_ = 0xff800000;
    auVar41 = vblendvps_avx(auVar42,auVar121,auVar41);
    auVar42 = vcmpps_avx(auVar43,auVar100,0);
    auVar42 = vblendvps_avx(auVar43,auVar121,auVar42);
    auVar42 = vblendvps_avx(auVar42,auVar41,auVar44);
    auVar125._0_4_ = local_420 + auVar89._0_4_;
    auVar125._4_4_ = fStack_41c + auVar89._4_4_;
    auVar125._8_4_ = fStack_418 + auVar89._8_4_;
    auVar125._12_4_ = fStack_414 + auVar89._12_4_;
    auVar125._16_4_ = fStack_410 + auVar89._16_4_;
    auVar125._20_4_ = fStack_40c + auVar89._20_4_;
    auVar125._24_4_ = fStack_408 + auVar89._24_4_;
    auVar125._28_4_ = fStack_404 + auVar89._28_4_;
    auVar41 = vcmpps_avx(auVar137,auVar125,2);
    auVar95._0_4_ = ray->tfar;
    auVar95._4_4_ = ray->mask;
    auVar95._8_4_ = ray->id;
    auVar95._12_4_ = ray->flags;
    auVar95 = vpermilps_avx(auVar95,0);
    auVar141._16_16_ = auVar95;
    auVar141._0_16_ = auVar95;
    auVar44 = vcmpps_avx(auVar125,auVar141,2);
    auVar41 = vandps_avx(auVar44,auVar41);
    local_2e0 = vmaxps_avx(local_460,auVar42);
    auVar42 = vcmpps_avx(auVar89,auVar100,4);
    auVar42 = vandps_avx(auVar45,auVar42);
    _local_400 = vandps_avx(auVar41,auVar42);
    local_540._0_4_ = local_420 + local_2e0._0_4_;
    local_540._4_4_ = fStack_41c + local_2e0._4_4_;
    local_540._8_4_ = fStack_418 + local_2e0._8_4_;
    local_540._12_4_ = fStack_414 + local_2e0._12_4_;
    local_540._16_4_ = fStack_410 + local_2e0._16_4_;
    local_540._20_4_ = fStack_40c + local_2e0._20_4_;
    local_540._24_4_ = fStack_408 + local_2e0._24_4_;
    local_540._28_4_ = fStack_404 + local_2e0._28_4_;
    auVar41 = vcmpps_avx(auVar137,local_540,2);
    auVar42 = vcmpps_avx(local_540,auVar141,2);
    auVar41 = vandps_avx(auVar42,auVar41);
    auVar42 = vcmpps_avx(auVar121,local_2e0,4);
    auVar42 = vandps_avx(auVar45,auVar42);
    local_4a0 = vandps_avx(auVar41,auVar42);
    local_2c0 = vorps_avx(_local_400,local_4a0);
    if ((((((((local_2c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_2c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_2c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_2c0 >> 0x7f,0) != '\0') ||
          (local_2c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_2c0 >> 0xbf,0) != '\0') ||
        (local_2c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_2c0[0x1f] < '\0') {
      auVar44 = vblendvps_avx(local_2e0,auVar89,_local_400);
      auVar43 = vblendvps_avx(auVar136,auVar156,_local_400);
      fVar140 = auVar132._0_4_ * fVar111 * fVar140;
      fVar145 = auVar132._4_4_ * fVar14 * fVar145;
      fVar146 = auVar132._8_4_ * fVar19 * fVar146;
      fVar147 = auVar132._12_4_ * fVar24 * fVar147;
      fVar148 = auVar132._16_4_ * fVar29 * fVar148;
      fVar149 = auVar132._20_4_ * fVar34 * fVar149;
      fVar150 = auVar132._24_4_ * fVar39 * fVar150;
      auVar41 = vcmpps_avx(local_440,auVar44,0);
      auVar42 = vcmpps_avx(auVar44,local_460,0);
      auVar41 = vorps_avx(auVar41,auVar42);
      auVar41 = vandps_avx(auVar45,auVar41);
      auVar89 = vcmpps_avx(local_4e0,auVar44,0);
      auVar42 = vandps_avx(auVar45,auVar89);
      fVar111 = auVar44._0_4_;
      fVar14 = auVar44._4_4_;
      fVar19 = auVar44._8_4_;
      fVar24 = auVar44._12_4_;
      fVar29 = auVar44._16_4_;
      fVar34 = auVar44._20_4_;
      fVar39 = auVar44._24_4_;
      fStack_31c = fVar114 * fVar145;
      local_320 = fVar102 * fVar140;
      fStack_318 = fVar17 * fVar146;
      fStack_314 = fVar22 * fVar147;
      fStack_310 = fVar27 * fVar148;
      fStack_30c = fVar32 * fVar149;
      fStack_308 = fVar37 * fVar150;
      fStack_304 = auVar40._12_4_;
      auVar134._0_4_ = fVar102 * fVar140 + fVar151 * (local_160 * fVar111 + fVar197);
      auVar134._4_4_ = fVar114 * fVar145 + fVar158 * (local_160 * fVar14 + fVar13);
      auVar134._8_4_ = fVar17 * fVar146 + fVar160 * (local_160 * fVar19 + fVar18);
      auVar134._12_4_ = fVar22 * fVar147 + fVar161 * (local_160 * fVar24 + fVar23);
      auVar134._16_4_ = fVar27 * fVar148 + fVar162 * (local_160 * fVar29 + fVar28);
      auVar134._20_4_ = fVar32 * fVar149 + fVar163 * (local_160 * fVar34 + fVar33);
      auVar134._24_4_ = fVar37 * fVar150 + fVar164 * (local_160 * fVar39 + fVar38);
      auVar134._28_4_ = auVar40._12_4_ + auVar89._28_4_ + fStack_284;
      fStack_33c = fStack_2fc * fVar114;
      local_340 = local_300 * fVar102;
      fStack_338 = fStack_2f8 * fVar17;
      fStack_334 = fStack_2f4 * fVar22;
      fStack_330 = fStack_2f0 * fVar27;
      fStack_32c = fStack_2ec * fVar32;
      fStack_328 = fStack_2e8 * fVar37;
      fStack_324 = local_160;
      fVar197 = auVar43._0_4_;
      fVar13 = auVar43._4_4_;
      auVar75._4_4_ = fStack_2fc * fVar114 * fVar13;
      auVar75._0_4_ = local_300 * fVar102 * fVar197;
      fVar102 = auVar43._8_4_;
      auVar75._8_4_ = fStack_2f8 * fVar17 * fVar102;
      fVar114 = auVar43._12_4_;
      auVar75._12_4_ = fStack_2f4 * fVar22 * fVar114;
      fVar18 = auVar43._16_4_;
      auVar75._16_4_ = fStack_2f0 * fVar27 * fVar18;
      fVar23 = auVar43._20_4_;
      auVar75._20_4_ = fStack_2ec * fVar32 * fVar23;
      fVar28 = auVar43._24_4_;
      auVar75._24_4_ = fStack_2e8 * fVar37 * fVar28;
      auVar75._28_4_ = local_160;
      auVar43 = vsubps_avx(auVar134,auVar75);
      local_c0._0_8_ = local_3e0._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar17;
      local_c0._12_4_ = -fVar22;
      local_c0._16_4_ = -fVar27;
      local_c0._20_4_ = -fVar32;
      local_c0._24_4_ = -fVar37;
      local_c0._28_4_ = -local_3e0._28_4_;
      auVar45 = vblendvps_avx(local_3e0,local_c0,auVar42);
      local_4c0 = vblendvps_avx(auVar45,auVar43,auVar41);
      auVar135 = ZEXT3264(local_360);
      local_a0 = fVar159 * fVar140;
      fStack_9c = fVar113 * fVar145;
      fStack_98 = fVar16 * fVar146;
      fStack_94 = fVar21 * fVar147;
      fStack_90 = fVar26 * fVar148;
      fStack_8c = fVar31 * fVar149;
      fStack_88 = fVar36 * fVar150;
      fStack_84 = local_c0._28_4_;
      auVar180._0_4_ = fVar151 * (fVar110 + local_140 * fVar111) + fVar159 * fVar140;
      auVar180._4_4_ = fVar158 * (fVar200 + local_140 * fVar14) + fVar113 * fVar145;
      auVar180._8_4_ = fVar160 * (fVar201 + local_140 * fVar19) + fVar16 * fVar146;
      auVar180._12_4_ = fVar161 * (fVar202 + local_140 * fVar24) + fVar21 * fVar147;
      auVar180._16_4_ = fVar162 * (fVar203 + local_140 * fVar29) + fVar26 * fVar148;
      auVar180._20_4_ = fVar163 * (fVar204 + local_140 * fVar34) + fVar31 * fVar149;
      auVar180._24_4_ = fVar164 * (fVar205 + local_140 * fVar39) + fVar36 * fVar150;
      auVar180._28_4_ = fVar57 + local_c0._28_4_;
      local_80 = local_300 * fVar159;
      fStack_7c = fStack_2fc * fVar113;
      fStack_78 = fStack_2f8 * fVar16;
      fStack_74 = fStack_2f4 * fVar21;
      fStack_70 = fStack_2f0 * fVar26;
      fStack_6c = fStack_2ec * fVar31;
      fStack_68 = fStack_2e8 * fVar36;
      fStack_64 = local_c0._28_4_;
      auVar76._4_4_ = fStack_2fc * fVar113 * fVar13;
      auVar76._0_4_ = local_300 * fVar159 * fVar197;
      auVar76._8_4_ = fStack_2f8 * fVar16 * fVar102;
      auVar76._12_4_ = fStack_2f4 * fVar21 * fVar114;
      auVar76._16_4_ = fStack_2f0 * fVar26 * fVar18;
      auVar76._20_4_ = fStack_2ec * fVar31 * fVar23;
      auVar76._24_4_ = fStack_2e8 * fVar36 * fVar28;
      auVar76._28_4_ = fVar57;
      auVar43 = vsubps_avx(auVar180,auVar76);
      local_100._0_8_ = local_360._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar16;
      local_100._12_4_ = -fVar21;
      local_100._16_4_ = -fVar26;
      local_100._20_4_ = -fVar31;
      local_100._24_4_ = -fVar36;
      local_100._28_4_ = -fVar48;
      auVar45 = vblendvps_avx(local_360,local_100,auVar42);
      local_1e0 = vblendvps_avx(auVar45,auVar43,auVar41);
      auVar139 = ZEXT3264(local_380);
      local_300 = local_300 * fVar152;
      fStack_2fc = fStack_2fc * fVar112;
      fStack_2f8 = fStack_2f8 * fVar15;
      fStack_2f4 = fStack_2f4 * fVar20;
      fStack_2f0 = fStack_2f0 * fVar25;
      fStack_2ec = fStack_2ec * fVar30;
      uStack_2e4 = auVar43._28_4_;
      fStack_2e8 = fStack_2e8 * fVar35;
      local_e0 = fVar152 * fVar140;
      fStack_dc = fVar112 * fVar145;
      fStack_d8 = fVar15 * fVar146;
      fStack_d4 = fVar20 * fVar147;
      fStack_d0 = fVar25 * fVar148;
      fStack_cc = fVar30 * fVar149;
      fStack_c8 = fVar35 * fVar150;
      fStack_c4 = auVar45._28_4_;
      auVar142._0_4_ = fVar152 * fVar140 + fVar151 * (fVar103 + fVar111 * local_480);
      auVar142._4_4_ = fVar112 * fVar145 + fVar158 * (fVar115 + fVar14 * local_480);
      auVar142._8_4_ = fVar15 * fVar146 + fVar160 * (fVar192 + fVar19 * local_480);
      auVar142._12_4_ = fVar20 * fVar147 + fVar161 * (fVar193 + fVar24 * local_480);
      auVar142._16_4_ = fVar25 * fVar148 + fVar162 * (fVar194 + fVar29 * local_480);
      auVar142._20_4_ = fVar30 * fVar149 + fVar163 * (fVar195 + fVar34 * local_480);
      auVar142._24_4_ = fVar35 * fVar150 + fVar164 * (fVar196 + fVar39 * local_480);
      auVar142._28_4_ = auVar45._28_4_ + fStack_3a4 + auVar95._12_4_;
      auVar43 = vrcpps_avx(auVar132);
      auVar77._4_4_ = fStack_2fc * fVar13;
      auVar77._0_4_ = local_300 * fVar197;
      auVar77._8_4_ = fStack_2f8 * fVar102;
      auVar77._12_4_ = fStack_2f4 * fVar114;
      auVar77._16_4_ = fStack_2f0 * fVar18;
      auVar77._20_4_ = fStack_2ec * fVar23;
      auVar77._24_4_ = fStack_2e8 * fVar28;
      auVar77._28_4_ = uStack_2e4;
      auVar89 = vsubps_avx(auVar142,auVar77);
      local_120._0_8_ = local_380._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar15;
      local_120._12_4_ = -fVar20;
      local_120._16_4_ = -fVar25;
      local_120._20_4_ = -fVar30;
      local_120._24_4_ = -fVar35;
      local_120._28_4_ = local_380._28_4_ ^ 0x80000000;
      auVar45 = vblendvps_avx(local_380,local_120,auVar42);
      local_1c0 = vblendvps_avx(auVar45,auVar89,auVar41);
      local_500 = auVar43._0_4_;
      fStack_4fc = auVar43._4_4_;
      auVar78._4_4_ = fStack_4fc * auVar132._4_4_;
      auVar78._0_4_ = local_500 * auVar132._0_4_;
      fStack_4f8 = auVar43._8_4_;
      auVar78._8_4_ = fStack_4f8 * auVar132._8_4_;
      fStack_4f4 = auVar43._12_4_;
      auVar78._12_4_ = fStack_4f4 * auVar132._12_4_;
      fStack_4f0 = auVar43._16_4_;
      auVar78._16_4_ = fStack_4f0 * auVar132._16_4_;
      fStack_4ec = auVar43._20_4_;
      auVar78._20_4_ = fStack_4ec * auVar132._20_4_;
      fStack_4e8 = auVar43._24_4_;
      auVar78._24_4_ = fStack_4e8 * auVar132._24_4_;
      auVar78._28_4_ = auVar132._28_4_;
      auVar206._8_4_ = 0x3f800000;
      auVar206._0_8_ = &DAT_3f8000003f800000;
      auVar206._12_4_ = 0x3f800000;
      auVar206._16_4_ = 0x3f800000;
      auVar206._20_4_ = 0x3f800000;
      auVar206._24_4_ = 0x3f800000;
      auVar206._28_4_ = 0x3f800000;
      auVar45 = vsubps_avx(auVar206,auVar78);
      auVar42 = vblendvps_avx(auVar206,ZEXT832(0) << 0x20,auVar42);
      auVar184 = ZEXT3264(auVar42);
      local_500 = local_500 + local_500 * auVar45._0_4_;
      fStack_4fc = fStack_4fc + fStack_4fc * auVar45._4_4_;
      fStack_4f8 = fStack_4f8 + fStack_4f8 * auVar45._8_4_;
      fStack_4f4 = fStack_4f4 + fStack_4f4 * auVar45._12_4_;
      fStack_4f0 = fStack_4f0 + fStack_4f0 * auVar45._16_4_;
      fStack_4ec = fStack_4ec + fStack_4ec * auVar45._20_4_;
      fStack_4e8 = fStack_4e8 + fStack_4e8 * auVar45._24_4_;
      fStack_4e4 = auVar43._28_4_ + auVar45._28_4_;
      auVar79._4_4_ = fVar13 * fStack_4fc;
      auVar79._0_4_ = fVar197 * local_500;
      auVar79._8_4_ = fVar102 * fStack_4f8;
      auVar79._12_4_ = fVar114 * fStack_4f4;
      auVar79._16_4_ = fVar18 * fStack_4f0;
      auVar79._20_4_ = fVar23 * fStack_4ec;
      auVar79._24_4_ = fVar28 * fStack_4e8;
      auVar79._28_4_ = fStack_4e4;
      local_260 = vblendvps_avx(auVar42,auVar79,auVar41);
      local_240 = ZEXT832(0) << 0x20;
      local_220._4_4_ = fVar14 + fStack_41c;
      local_220._0_4_ = fVar111 + local_420;
      fStack_218 = fVar19 + fStack_418;
      fStack_214 = fVar24 + fStack_414;
      fStack_210 = fVar29 + fStack_410;
      fStack_20c = fVar34 + fStack_40c;
      fStack_208 = fVar39 + fStack_408;
      fStack_204 = auVar44._28_4_ + fStack_404;
      local_200 = local_4c0;
      auVar182 = ZEXT3264(local_540);
      uVar87 = vmovmskps_avx(local_2c0);
      uVar88 = CONCAT44((int)((ulong)lVar10 >> 0x20),uVar87);
      auVar144 = ZEXT3264(local_3e0);
      fVar197 = fStack_3a4;
      local_5c0 = context;
      local_5b8 = pSVar85;
      local_548 = line;
      _local_520 = auVar136;
      fStack_47c = local_480;
      fStack_478 = local_480;
      fStack_474 = local_480;
      fStack_470 = local_480;
      fStack_46c = local_480;
      fStack_468 = local_480;
      fStack_464 = local_480;
      do {
        local_578.hit = (RTCHitN *)&local_5b0;
        uVar12 = 0;
        if (uVar88 != 0) {
          for (; (uVar88 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        local_598 = *(uint *)(local_280 + uVar12 * 4);
        pGVar9 = (pSVar85->geometries).items[local_598].ptr;
        local_578.ray = (RTCRayN *)ray;
        if ((pGVar9->mask & ray->mask) == 0) {
LAB_010a3387:
          uVar88 = uVar88 ^ 1L << (uVar12 & 0x3f);
          bVar86 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_5a4 = *(undefined4 *)(local_260 + uVar12 * 4);
            local_5a0 = *(undefined4 *)(local_240 + uVar12 * 4);
            local_59c = (local_548->primIDs).field_0.i[uVar12];
            local_5b0 = *(undefined4 *)(local_200 + uVar12 * 4);
            local_5ac = *(undefined4 *)(local_1e0 + uVar12 * 4);
            local_5a8 = *(undefined4 *)(local_1c0 + uVar12 * 4);
            local_594 = context->user->instID[0];
            local_590 = context->user->instPrimID[0];
            local_420 = ray->tfar;
            ray->tfar = *(float *)(local_220 + uVar12 * 4);
            local_5c4 = -1;
            local_578.geometryUserPtr = pGVar9->userPtr;
            local_578.context = context->user;
            local_578.N = 1;
            local_1a0 = auVar184._0_32_;
            local_578.valid = &local_5c4;
            if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar9->occlusionFilterN)(&local_578);
              auVar184 = ZEXT3264(local_1a0);
              auVar182 = ZEXT3264(local_540);
              auVar144 = ZEXT3264(local_3e0);
              auVar139 = ZEXT3264(local_380);
              auVar135 = ZEXT3264(local_360);
              context = local_5c0;
              pSVar85 = local_5b8;
              fVar103 = (float)local_3c0._0_4_;
              fVar115 = (float)local_3c0._4_4_;
              fVar192 = fStack_3b8;
              fVar193 = fStack_3b4;
              fVar194 = fStack_3b0;
              fVar195 = fStack_3ac;
              fVar196 = fStack_3a8;
              fVar197 = fStack_3a4;
              fVar110 = (float)local_3a0._0_4_;
              fVar200 = (float)local_3a0._4_4_;
              fVar201 = fStack_398;
              fVar202 = fStack_394;
              fVar203 = fStack_390;
              fVar204 = fStack_38c;
              fVar205 = fStack_388;
              fVar94 = fStack_384;
              auVar136._0_4_ = (float)local_520._0_4_;
              auVar136._4_4_ = (float)local_520._4_4_;
              auVar136._8_4_ = fStack_518;
              auVar136._12_4_ = fStack_514;
              auVar136._16_4_ = fStack_510;
              auVar136._20_4_ = fStack_50c;
              auVar136._24_4_ = fStack_508;
              if (*local_578.valid != 0) goto LAB_010a34f3;
LAB_010a3585:
              ray->tfar = local_420;
              goto LAB_010a3387;
            }
LAB_010a34f3:
            p_Var11 = context->args->filter;
            if (p_Var11 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var11)(&local_578);
                auVar184 = ZEXT3264(local_1a0);
                auVar182 = ZEXT3264(local_540);
                auVar144 = ZEXT3264(local_3e0);
                auVar139 = ZEXT3264(local_380);
                auVar135 = ZEXT3264(local_360);
                context = local_5c0;
                pSVar85 = local_5b8;
                fVar103 = (float)local_3c0._0_4_;
                fVar115 = (float)local_3c0._4_4_;
                fVar192 = fStack_3b8;
                fVar193 = fStack_3b4;
                fVar194 = fStack_3b0;
                fVar195 = fStack_3ac;
                fVar196 = fStack_3a8;
                fVar197 = fStack_3a4;
                fVar110 = (float)local_3a0._0_4_;
                fVar200 = (float)local_3a0._4_4_;
                fVar201 = fStack_398;
                fVar202 = fStack_394;
                fVar203 = fStack_390;
                fVar204 = fStack_38c;
                fVar205 = fStack_388;
                fVar94 = fStack_384;
                auVar136._0_4_ = (float)local_520._0_4_;
                auVar136._4_4_ = (float)local_520._4_4_;
                auVar136._8_4_ = fStack_518;
                auVar136._12_4_ = fStack_514;
                auVar136._16_4_ = fStack_510;
                auVar136._20_4_ = fStack_50c;
                auVar136._24_4_ = fStack_508;
              }
              if (*local_578.valid == 0) goto LAB_010a3585;
            }
          }
          bVar86 = 0;
        }
      } while ((bVar86 != 0) && (uVar88 != 0));
      auVar41 = vandps_avx(local_4a0,_local_400);
      fVar152 = ray->tfar;
      auVar101._4_4_ = fVar152;
      auVar101._0_4_ = fVar152;
      auVar101._8_4_ = fVar152;
      auVar101._12_4_ = fVar152;
      auVar101._16_4_ = fVar152;
      auVar101._20_4_ = fVar152;
      auVar101._24_4_ = fVar152;
      auVar101._28_4_ = fVar152;
      auVar42 = vcmpps_avx(auVar182._0_32_,auVar101,2);
      auVar44 = auVar41 & auVar42;
      if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar44 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar44 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar44 >> 0x7f,0) == '\0') &&
            (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar44 >> 0xbf,0) == '\0') &&
          (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar44[0x1f])
      {
        return (bool)(bVar86 ^ 1);
      }
      auVar43 = vcmpps_avx(local_2e0,local_4e0,0);
      auVar44 = vblendvps_avx(auVar144._0_32_,local_c0,auVar43);
      auVar45 = vblendvps_avx(auVar135._0_32_,local_100,auVar43);
      auVar43 = vblendvps_avx(auVar139._0_32_,local_120,auVar43);
      auVar89 = vcmpps_avx(local_2e0,local_440,0);
      auVar90 = vcmpps_avx(local_2e0,local_460,0);
      auVar89 = vorps_avx(auVar89,auVar90);
      fVar152 = local_2e0._0_4_;
      fVar159 = local_2e0._4_4_;
      fVar102 = local_2e0._8_4_;
      fVar111 = local_2e0._12_4_;
      fVar112 = local_2e0._16_4_;
      fVar113 = local_2e0._20_4_;
      fVar114 = local_2e0._24_4_;
      auVar138._0_4_ =
           (float)local_180._0_4_ * (fVar152 * local_160 + (float)local_2a0._0_4_) + local_320;
      auVar138._4_4_ =
           (float)local_180._4_4_ * (fVar159 * fStack_15c + (float)local_2a0._4_4_) + fStack_31c;
      auVar138._8_4_ = fStack_178 * (fVar102 * fStack_158 + fStack_298) + fStack_318;
      auVar138._12_4_ = fStack_174 * (fVar111 * fStack_154 + fStack_294) + fStack_314;
      auVar138._16_4_ = fStack_170 * (fVar112 * fStack_150 + fStack_290) + fStack_310;
      auVar138._20_4_ = fStack_16c * (fVar113 * fStack_14c + fStack_28c) + fStack_30c;
      auVar138._24_4_ = fStack_168 * (fVar114 * fStack_148 + fStack_288) + fStack_308;
      auVar138._28_4_ = auVar90._28_4_ + fStack_284 + fStack_304;
      auVar143._0_4_ = (float)local_180._0_4_ * (fVar110 + fVar152 * local_140) + local_a0;
      auVar143._4_4_ = (float)local_180._4_4_ * (fVar200 + fVar159 * fStack_13c) + fStack_9c;
      auVar143._8_4_ = fStack_178 * (fVar201 + fVar102 * fStack_138) + fStack_98;
      auVar143._12_4_ = fStack_174 * (fVar202 + fVar111 * fStack_134) + fStack_94;
      auVar143._16_4_ = fStack_170 * (fVar203 + fVar112 * fStack_130) + fStack_90;
      auVar143._20_4_ = fStack_16c * (fVar204 + fVar113 * fStack_12c) + fStack_8c;
      auVar143._24_4_ = fStack_168 * (fVar205 + fVar114 * fStack_128) + fStack_88;
      auVar143._28_4_ = fVar94 + auVar144._28_4_ + fStack_84;
      auVar157._0_4_ = (float)local_180._0_4_ * (fVar103 + fVar152 * local_480) + local_e0;
      auVar157._4_4_ = (float)local_180._4_4_ * (fVar115 + fVar159 * fStack_47c) + fStack_dc;
      auVar157._8_4_ = fStack_178 * (fVar192 + fVar102 * fStack_478) + fStack_d8;
      auVar157._12_4_ = fStack_174 * (fVar193 + fVar111 * fStack_474) + fStack_d4;
      auVar157._16_4_ = fStack_170 * (fVar194 + fVar112 * fStack_470) + fStack_d0;
      auVar157._20_4_ = fStack_16c * (fVar195 + fVar113 * fStack_46c) + fStack_cc;
      auVar157._24_4_ = fStack_168 * (fVar196 + fVar114 * fStack_468) + fStack_c8;
      auVar157._28_4_ = fVar197 + local_2e0._28_4_ + fStack_c4;
      auVar80._4_4_ = auVar136._4_4_ * fStack_33c;
      auVar80._0_4_ = auVar136._0_4_ * local_340;
      auVar80._8_4_ = auVar136._8_4_ * fStack_338;
      auVar80._12_4_ = auVar136._12_4_ * fStack_334;
      auVar80._16_4_ = auVar136._16_4_ * fStack_330;
      auVar80._20_4_ = auVar136._20_4_ * fStack_32c;
      auVar80._24_4_ = auVar136._24_4_ * fStack_328;
      auVar80._28_4_ = uStack_164;
      auVar90 = vsubps_avx(auVar138,auVar80);
      auVar81._4_4_ = auVar136._4_4_ * fStack_7c;
      auVar81._0_4_ = auVar136._0_4_ * local_80;
      auVar81._8_4_ = auVar136._8_4_ * fStack_78;
      auVar81._12_4_ = auVar136._12_4_ * fStack_74;
      auVar81._16_4_ = auVar136._16_4_ * fStack_70;
      auVar81._20_4_ = auVar136._20_4_ * fStack_6c;
      auVar81._24_4_ = auVar136._24_4_ * fStack_68;
      auVar81._28_4_ = uStack_164;
      auVar96 = vsubps_avx(auVar143,auVar81);
      auVar82._4_4_ = auVar136._4_4_ * fStack_2fc;
      auVar82._0_4_ = auVar136._0_4_ * local_300;
      auVar82._8_4_ = auVar136._8_4_ * fStack_2f8;
      auVar82._12_4_ = auVar136._12_4_ * fStack_2f4;
      auVar82._16_4_ = auVar136._16_4_ * fStack_2f0;
      auVar82._20_4_ = auVar136._20_4_ * fStack_2ec;
      auVar82._24_4_ = auVar136._24_4_ * fStack_2e8;
      auVar82._28_4_ = uStack_164;
      auVar46 = vsubps_avx(auVar157,auVar82);
      local_200 = vblendvps_avx(auVar44,auVar90,auVar89);
      local_1e0 = vblendvps_avx(auVar45,auVar96,auVar89);
      local_1c0 = vblendvps_avx(auVar43,auVar46,auVar89);
      auVar83._4_4_ = auVar136._4_4_ * fStack_4fc;
      auVar83._0_4_ = auVar136._0_4_ * local_500;
      auVar83._8_4_ = auVar136._8_4_ * fStack_4f8;
      auVar83._12_4_ = auVar136._12_4_ * fStack_4f4;
      auVar83._16_4_ = auVar136._16_4_ * fStack_4f0;
      auVar83._20_4_ = auVar136._20_4_ * fStack_4ec;
      auVar83._24_4_ = auVar136._24_4_ * fStack_4e8;
      auVar83._28_4_ = auVar90._28_4_;
      local_260 = vblendvps_avx(auVar184._0_32_,auVar83,auVar89);
      auVar41 = vandps_avx(auVar42,auVar41);
      local_240 = ZEXT832(0) << 0x20;
      _local_220 = auVar182._0_32_;
      uVar87 = vmovmskps_avx(auVar41);
      uVar88 = CONCAT44((int)(uVar88 >> 0x20),uVar87);
      pSVar85 = context->scene;
      do {
        local_578.hit = (RTCHitN *)&local_5b0;
        local_578.valid = &local_5c4;
        uVar12 = 0;
        if (uVar88 != 0) {
          for (; (uVar88 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        local_598 = *(uint *)(local_280 + uVar12 * 4);
        pGVar9 = (pSVar85->geometries).items[local_598].ptr;
        if ((pGVar9->mask & ray->mask) == 0) {
LAB_010a3742:
          uVar88 = uVar88 ^ 1L << (uVar12 & 0x3f);
          bVar84 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_5a4 = *(undefined4 *)(local_260 + uVar12 * 4);
            local_5a0 = *(undefined4 *)(local_240 + uVar12 * 4);
            local_59c = (local_548->primIDs).field_0.i[uVar12];
            local_5b0 = *(undefined4 *)(local_200 + uVar12 * 4);
            local_5ac = *(undefined4 *)(local_1e0 + uVar12 * 4);
            local_5a8 = *(undefined4 *)(local_1c0 + uVar12 * 4);
            local_594 = context->user->instID[0];
            local_590 = context->user->instPrimID[0];
            local_480 = ray->tfar;
            ray->tfar = *(float *)(local_220 + uVar12 * 4);
            local_5c4 = -1;
            local_578.geometryUserPtr = pGVar9->userPtr;
            local_578.context = context->user;
            local_578.N = 1;
            local_540._0_8_ = pSVar85;
            local_578.ray = (RTCRayN *)ray;
            if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar9->occlusionFilterN)(&local_578);
              context = local_5c0;
              pSVar85 = (Scene *)local_540._0_8_;
              if (*local_578.valid != 0) goto LAB_010a385a;
LAB_010a38a7:
              ray->tfar = local_480;
              goto LAB_010a3742;
            }
LAB_010a385a:
            p_Var11 = context->args->filter;
            if (p_Var11 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var11)(&local_578);
                context = local_5c0;
                pSVar85 = (Scene *)local_540._0_8_;
              }
              if (*local_578.valid == 0) goto LAB_010a38a7;
            }
          }
          bVar84 = 0;
        }
        if ((bVar84 == 0) || (uVar88 == 0)) {
          return (bool)(bVar86 ^ 1 | bVar84 ^ 1);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
        return false;
      }